

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_parsed_ir.cpp
# Opt level: O1

void __thiscall spirv_cross::ParsedIR::mark_used_as_array_length(ParsedIR *this,ID id)

{
  Variant *this_00;
  Types TVar1;
  int iVar2;
  uint *puVar3;
  size_t sVar4;
  SPIRConstantOp *pSVar5;
  SPIRConstant *pSVar6;
  ulong uVar7;
  long lVar8;
  
  uVar7 = (ulong)id.id;
  while( true ) {
    while( true ) {
      this_00 = (this->ids).super_VectorView<spirv_cross::Variant>.ptr + uVar7;
      TVar1 = this_00->type;
      if (TVar1 != TypeConstantOp) {
        if (TVar1 != TypeUndef) {
          if (TVar1 != TypeConstant) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]SPIRV-Cross/spirv_cross_parsed_ir.cpp"
                          ,0x225,"void spirv_cross::ParsedIR::mark_used_as_array_length(ID)");
          }
          pSVar6 = Variant::get<spirv_cross::SPIRConstant>(this_00);
          pSVar6->is_used_as_array_length = true;
        }
        return;
      }
      pSVar5 = Variant::get<spirv_cross::SPIRConstantOp>(this_00);
      iVar2 = *(int *)&(pSVar5->super_IVariant).field_0xc;
      puVar3 = (pSVar5->arguments).super_VectorView<unsigned_int>.ptr;
      if (iVar2 != 0x52) break;
      mark_used_as_array_length(this,(ID)*puVar3);
      uVar7 = (ulong)(pSVar5->arguments).super_VectorView<unsigned_int>.ptr[1];
    }
    if (iVar2 != 0x51) break;
    uVar7 = (ulong)*puVar3;
  }
  sVar4 = (pSVar5->arguments).super_VectorView<unsigned_int>.buffer_size;
  if (sVar4 == 0) {
    return;
  }
  lVar8 = 0;
  do {
    mark_used_as_array_length(this,(ID)*(uint32_t *)((long)puVar3 + lVar8));
    lVar8 = lVar8 + 4;
  } while (sVar4 << 2 != lVar8);
  return;
}

Assistant:

void ParsedIR::mark_used_as_array_length(ID id)
{
	switch (ids[id].get_type())
	{
	case TypeConstant:
		get<SPIRConstant>(id).is_used_as_array_length = true;
		break;

	case TypeConstantOp:
	{
		auto &cop = get<SPIRConstantOp>(id);
		if (cop.opcode == OpCompositeExtract)
			mark_used_as_array_length(cop.arguments[0]);
		else if (cop.opcode == OpCompositeInsert)
		{
			mark_used_as_array_length(cop.arguments[0]);
			mark_used_as_array_length(cop.arguments[1]);
		}
		else
			for (uint32_t arg_id : cop.arguments)
				mark_used_as_array_length(arg_id);
		break;
	}

	case TypeUndef:
		break;

	default:
		assert(0);
	}
}